

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdot.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  float fVar1;
  code *pcVar2;
  reference pvVar3;
  float *pfVar4;
  anon_struct_24_3_39c1e80b *paVar5;
  rep rVar6;
  double *pdVar7;
  anon_struct_20_2_7fa0a0b9 *paVar8;
  anon_struct_36_2_7fa0a0b9 *paVar9;
  long in_RSI;
  int in_EDI;
  double dVar10;
  ggml_type_traits_cpu *vdot;
  float result;
  double t;
  time_point t2;
  time_point t1;
  int k;
  int iloop;
  double exactSum;
  double sumq;
  double sum;
  double maxqt;
  double sumqt2;
  double sumqt;
  double maxt;
  double sumt2;
  double sumt;
  vector<block_q8_0,_std::allocator<block_q8_0>_> q8;
  vector<block_q4_1,_std::allocator<block_q4_1>_> q41;
  vector<block_q4_0,_std::allocator<block_q4_0>_> q40;
  ggml_type_traits_cpu *funcs_cpu;
  int n8;
  int n4;
  vector<float,_std::allocator<float>_> y1;
  vector<float,_std::allocator<float>_> x1;
  mt19937 rndm;
  bool useQ4_1;
  bool scalar;
  int nloop;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffe9e8;
  undefined4 in_stack_ffffffffffffe9f0;
  undefined4 in_stack_ffffffffffffe9f4;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffe9f8;
  allocator_type *in_stack_ffffffffffffea00;
  size_type in_stack_ffffffffffffea08;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_ffffffffffffea10;
  int k_00;
  type in_stack_ffffffffffffea18;
  anon_struct_20_2_7fa0a0b9 *in_stack_ffffffffffffea20;
  int local_1504;
  int local_1500;
  int local_14fc;
  duration<long,_std::ratio<1L,_1000000000L>_> local_14f0;
  undefined8 local_14e8;
  undefined8 *local_14e0;
  float local_14d4;
  undefined8 local_14d0;
  rep local_14c8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_14c0;
  double local_14b8;
  undefined8 local_14b0;
  undefined8 local_14a8;
  int local_14a0;
  int local_149c;
  double local_1498;
  double local_1490;
  double local_1488;
  double local_1480;
  double local_1478;
  double local_1470;
  double local_1468;
  double local_1460;
  double local_1458;
  undefined8 *local_1400;
  undefined4 local_13f4;
  undefined4 local_13f0;
  vector<float,_std::allocator<float>_> local_13e8 [2];
  vector<float,_std::allocator<float>_> local_13b8 [209];
  byte local_16;
  byte local_15;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  if (in_EDI < 2) {
    local_14fc = 10;
  }
  else {
    local_14fc = atoi(*(char **)(in_RSI + 8));
  }
  local_14 = local_14fc;
  if (local_8 < 3) {
    local_1500 = 0;
  }
  else {
    local_1500 = atoi(*(char **)(local_10 + 0x10));
  }
  local_15 = local_1500 != 0;
  if (local_8 < 4) {
    local_1504 = 0;
  }
  else {
    local_1504 = atoi(*(char **)(local_10 + 0x18));
  }
  local_16 = local_1504 != 0;
  if (((local_15 & 1) == 0) || (!(bool)local_16)) {
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine
              ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
               (result_type)in_stack_ffffffffffffe9e8);
    std::allocator<float>::allocator((allocator<float> *)0x1033d4);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffea10.__r,
               in_stack_ffffffffffffea08,(allocator_type *)in_stack_ffffffffffffea00);
    std::allocator<float>::~allocator((allocator<float> *)0x1033fd);
    std::allocator<float>::allocator((allocator<float> *)0x103412);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffea10.__r,
               in_stack_ffffffffffffea08,(allocator_type *)in_stack_ffffffffffffea00);
    std::allocator<float>::~allocator((allocator<float> *)0x10343b);
    local_13f0 = 0x2000;
    local_13f4 = 0x2000;
    local_1400 = (undefined8 *)ggml_get_type_traits_cpu(local_16 & 1 | 2);
    std::vector<block_q4_0,_std::allocator<block_q4_0>_>::vector
              ((vector<block_q4_0,_std::allocator<block_q4_0>_> *)0x1034c7);
    std::vector<block_q4_1,_std::allocator<block_q4_1>_>::vector
              ((vector<block_q4_1,_std::allocator<block_q4_1>_> *)0x1034d4);
    if ((local_16 & 1) == 0) {
      std::vector<block_q4_0,_std::allocator<block_q4_0>_>::resize
                ((vector<block_q4_0,_std::allocator<block_q4_0>_> *)in_stack_ffffffffffffea10.__r,
                 in_stack_ffffffffffffea08);
    }
    else {
      std::vector<block_q4_1,_std::allocator<block_q4_1>_>::resize
                ((vector<block_q4_1,_std::allocator<block_q4_1>_> *)in_stack_ffffffffffffea10.__r,
                 in_stack_ffffffffffffea08);
    }
    std::allocator<block_q8_0>::allocator((allocator<block_q8_0> *)0x1035ba);
    std::vector<block_q8_0,_std::allocator<block_q8_0>_>::vector
              ((vector<block_q8_0,_std::allocator<block_q8_0>_> *)in_stack_ffffffffffffea10.__r,
               in_stack_ffffffffffffea08,in_stack_ffffffffffffea00);
    std::allocator<block_q8_0>::~allocator((allocator<block_q8_0> *)0x1035e6);
    local_1458 = 0.0;
    local_1460 = 0.0;
    local_1468 = 0.0;
    local_1470 = 0.0;
    local_1478 = 0.0;
    local_1480 = 0.0;
    local_1488 = 0.0;
    local_1490 = 0.0;
    local_1498 = 0.0;
    for (local_149c = 0; local_149c < local_14; local_149c = local_149c + 1) {
      fillRandomGaussianFloats
                ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffea20,
                 (mt19937 *)in_stack_ffffffffffffea18.__r,
                 (float)((ulong)in_stack_ffffffffffffea10.__r >> 0x20));
      fillRandomGaussianFloats
                ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffea20,
                 (mt19937 *)in_stack_ffffffffffffea18.__r,
                 (float)((ulong)in_stack_ffffffffffffea10.__r >> 0x20));
      for (local_14a0 = 0; k_00 = (int)((ulong)in_stack_ffffffffffffea10.__r >> 0x20),
          local_14a0 < 0x40000; local_14a0 = local_14a0 + 1) {
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_13b8,(long)local_14a0)
        ;
        fVar1 = *pvVar3;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_13e8,(long)local_14a0)
        ;
        local_1498 = (double)(fVar1 * *pvVar3) + local_1498;
      }
      if ((local_16 & 1) == 0) {
        pcVar2 = (code *)*local_1400;
        pfVar4 = std::vector<float,_std::allocator<float>_>::data
                           ((vector<float,_std::allocator<float>_> *)0x1037f7);
        paVar8 = std::vector<block_q4_0,_std::allocator<block_q4_0>_>::data
                           ((vector<block_q4_0,_std::allocator<block_q4_0>_> *)0x10380c);
        (*pcVar2)(pfVar4,paVar8,0x40000);
      }
      else {
        pcVar2 = (code *)*local_1400;
        pfVar4 = std::vector<float,_std::allocator<float>_>::data
                           ((vector<float,_std::allocator<float>_> *)0x1037a4);
        paVar5 = std::vector<block_q4_1,_std::allocator<block_q4_1>_>::data
                           ((vector<block_q4_1,_std::allocator<block_q4_1>_> *)0x1037b9);
        (*pcVar2)(pfVar4,paVar5,0x40000);
      }
      local_14a8 = std::chrono::_V2::system_clock::now();
      if ((local_16 & 1) == 0) {
        paVar8 = std::vector<block_q4_0,_std::allocator<block_q4_0>_>::data
                           ((vector<block_q4_0,_std::allocator<block_q4_0>_> *)0x1038ad);
        pfVar4 = std::vector<float,_std::allocator<float>_>::data
                           ((vector<float,_std::allocator<float>_> *)0x1038c2);
        dVar10 = dot(0x2000,paVar8,pfVar4);
        local_1488 = dVar10 + local_1488;
      }
      else {
        paVar5 = std::vector<block_q4_1,_std::allocator<block_q4_1>_>::data
                           ((vector<block_q4_1,_std::allocator<block_q4_1>_> *)0x10384e);
        pfVar4 = std::vector<float,_std::allocator<float>_>::data
                           ((vector<float,_std::allocator<float>_> *)0x103863);
        dVar10 = dot41(0x2000,paVar5,pfVar4);
        local_1488 = dVar10 + local_1488;
      }
      local_14b0 = std::chrono::_V2::system_clock::now();
      local_14c8 = (rep)std::chrono::operator-
                                  (in_stack_ffffffffffffe9f8,
                                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0))
      ;
      local_14c0.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                          (in_stack_ffffffffffffe9e8);
      rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_14c0);
      local_14b8 = (double)rVar6 * 0.001;
      local_1458 = local_1458 + local_14b8;
      local_1460 = local_14b8 * local_14b8 + local_1460;
      pdVar7 = std::max<double>(&local_1468,&local_14b8);
      local_1468 = *pdVar7;
      local_14d0 = std::chrono::_V2::system_clock::now();
      local_14a8 = local_14d0;
      if ((local_15 & 1) == 0) {
        local_14e0 = (undefined8 *)ggml_get_type_traits_cpu(*(undefined4 *)(local_1400 + 2));
        pcVar2 = (code *)*local_14e0;
        pfVar4 = std::vector<float,_std::allocator<float>_>::data
                           ((vector<float,_std::allocator<float>_> *)0x103aea);
        paVar9 = std::vector<block_q8_0,_std::allocator<block_q8_0>_>::data
                           ((vector<block_q8_0,_std::allocator<block_q8_0>_> *)0x103afc);
        (*pcVar2)(pfVar4,paVar9,0x40000);
        if ((local_16 & 1) == 0) {
          pcVar2 = (code *)local_1400[1];
          in_stack_ffffffffffffea20 =
               std::vector<block_q4_0,_std::allocator<block_q4_0>_>::data
                         ((vector<block_q4_0,_std::allocator<block_q4_0>_> *)0x103ba3);
          paVar9 = std::vector<block_q8_0,_std::allocator<block_q8_0>_>::data
                             ((vector<block_q8_0,_std::allocator<block_q8_0>_> *)0x103bb5);
          in_stack_ffffffffffffe9f0 = 1;
          in_stack_ffffffffffffe9e8 = (duration<long,_std::ratio<1L,_1000000000L>_> *)0x0;
          (*pcVar2)(0x40000,&local_14d4,0,in_stack_ffffffffffffea20,0,paVar9);
        }
        else {
          pcVar2 = (code *)local_1400[1];
          paVar5 = std::vector<block_q4_1,_std::allocator<block_q4_1>_>::data
                             ((vector<block_q4_1,_std::allocator<block_q4_1>_> *)0x103b3a);
          paVar9 = std::vector<block_q8_0,_std::allocator<block_q8_0>_>::data
                             ((vector<block_q8_0,_std::allocator<block_q8_0>_> *)0x103b4c);
          in_stack_ffffffffffffe9f0 = 1;
          in_stack_ffffffffffffe9e8 = (duration<long,_std::ratio<1L,_1000000000L>_> *)0x0;
          (*pcVar2)(0x40000,&local_14d4,0,paVar5,0,paVar9);
        }
      }
      else {
        std::vector<float,_std::allocator<float>_>::data
                  ((vector<float,_std::allocator<float>_> *)0x103a43);
        std::vector<block_q8_0,_std::allocator<block_q8_0>_>::data
                  ((vector<block_q8_0,_std::allocator<block_q8_0>_> *)0x103a55);
        quantize_row_q8_0_reference
                  (&in_stack_ffffffffffffea20->d,(block_q8_0 *)in_stack_ffffffffffffea18.__r,k_00);
        paVar8 = std::vector<block_q4_0,_std::allocator<block_q4_0>_>::data
                           ((vector<block_q4_0,_std::allocator<block_q4_0>_> *)0x103a76);
        paVar9 = std::vector<block_q8_0,_std::allocator<block_q8_0>_>::data
                           ((vector<block_q8_0,_std::allocator<block_q8_0>_> *)0x103a88);
        dot_q4_q8(0x40000,&local_14d4,paVar8,paVar9);
      }
      local_1490 = local_1490 + (double)local_14d4;
      local_14e8 = std::chrono::_V2::system_clock::now();
      local_14b0 = local_14e8;
      in_stack_ffffffffffffea18 =
           std::chrono::operator-
                     (in_stack_ffffffffffffe9f8,
                      (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
      in_stack_ffffffffffffea10 =
           std::chrono::
           duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                     (in_stack_ffffffffffffe9e8);
      local_14f0.__r = in_stack_ffffffffffffea10.__r;
      rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_14f0);
      local_14b8 = (double)rVar6 * 0.001;
      local_1470 = local_1470 + local_14b8;
      local_1478 = local_14b8 * local_14b8 + local_1478;
      in_stack_ffffffffffffea00 = (allocator_type *)std::max<double>(&local_1480,&local_14b8);
      local_1480 = *(double *)in_stack_ffffffffffffea00;
    }
    local_1488 = local_1488 / (double)local_14;
    local_1490 = local_1490 / (double)local_14;
    local_1498 = local_1498 / (double)local_14;
    printf("Exact result: <dot> = %g\n",local_1498);
    printf("<dot> = %g, %g\n",local_1488,local_1490);
    local_1458 = local_1458 / (double)local_14;
    local_1460 = -local_1458 * local_1458 + local_1460 / (double)local_14;
    if (0.0 < local_1460) {
      local_1460 = sqrt(local_1460);
    }
    printf("time = %g +/- %g us. maxt = %g us\n",local_1458,local_1460,local_1468);
    local_1470 = local_1470 / (double)local_14;
    local_1478 = -local_1470 * local_1470 + local_1478 / (double)local_14;
    if (0.0 < local_1478) {
      local_1478 = sqrt(local_1478);
    }
    printf("timeq = %g +/- %g us. maxt = %g us\n",local_1470,local_1478,local_1480);
    local_4 = 0;
    std::vector<block_q8_0,_std::allocator<block_q8_0>_>::~vector
              ((vector<block_q8_0,_std::allocator<block_q8_0>_> *)in_stack_ffffffffffffea00);
    std::vector<block_q4_1,_std::allocator<block_q4_1>_>::~vector
              ((vector<block_q4_1,_std::allocator<block_q4_1>_> *)in_stack_ffffffffffffea00);
    std::vector<block_q4_0,_std::allocator<block_q4_0>_>::~vector
              ((vector<block_q4_0,_std::allocator<block_q4_0>_> *)in_stack_ffffffffffffea00);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffea00);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffea00);
  }
  else {
    printf("It is not possible to use Q4_1 quantization and scalar implementations\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv) {

    int nloop = argc > 1 ? atoi(argv[1]) : 10;
    bool scalar = argc > 2 ? atoi(argv[2]) : false;
    bool useQ4_1 = argc > 3 ? atoi(argv[3]) : false;

    if (scalar && useQ4_1) {
        printf("It is not possible to use Q4_1 quantization and scalar implementations\n");
        return 1;
    }

    std::mt19937 rndm(1234);

    std::vector<float> x1(kVecSize), y1(kVecSize);
    int n4 = useQ4_1 ? kVecSize / QK4_1 : kVecSize / QK4_0; n4 = 64*((n4 + 63)/64);
    int n8 = kVecSize / QK8_0; n8 = 64*((n8 + 63)/64);

    const auto * funcs_cpu = ggml_get_type_traits_cpu(useQ4_1 ? GGML_TYPE_Q4_1 : GGML_TYPE_Q4_0);

    std::vector<block_q4_0> q40;
    std::vector<block_q4_1> q41;
    if (useQ4_1) q41.resize(n4);
    else q40.resize(n4);
    std::vector<block_q8_0> q8(n8);
    double sumt = 0, sumt2 = 0, maxt = 0;
    double sumqt = 0, sumqt2 = 0, maxqt = 0;
    double sum = 0, sumq = 0, exactSum = 0;
    for (int iloop=0; iloop<nloop; ++iloop) {

        // Fill vector x with random numbers
        fillRandomGaussianFloats(x1, rndm);

        // Fill vector y with random numbers
        fillRandomGaussianFloats(y1, rndm);

        // Compute the exact dot product
        for (int k=0; k<kVecSize; ++k) exactSum += x1[k]*y1[k];

        // quantize x.
        // Note, we do not include this in the timing as in practical application
        // we already have the quantized model weights.
        if (useQ4_1) {
            funcs_cpu->from_float(x1.data(), q41.data(), kVecSize);
        } else {
            funcs_cpu->from_float(x1.data(), q40.data(), kVecSize);
        }

        // Now measure time the dot product needs using the "scalar" version above
        auto t1 = std::chrono::high_resolution_clock::now();
        if (useQ4_1) sum += dot41(kVecSize / QK4_1, q41.data(), y1.data());
        else sum += dot(kVecSize / QK4_0, q40.data(), y1.data());
        auto t2 = std::chrono::high_resolution_clock::now();
        auto t = 1e-3*std::chrono::duration_cast<std::chrono::nanoseconds>(t2-t1).count();
        sumt += t; sumt2 += t*t; maxt = std::max(maxt, t);

        // And now measure the time needed to quantize y and perform the dot product with the quantized y
        t1 = std::chrono::high_resolution_clock::now();
        float result;
        if (scalar) {
            quantize_row_q8_0_reference(y1.data(), q8.data(), kVecSize);
            dot_q4_q8(kVecSize, &result, q40.data(), q8.data());
        }
        else {
            const auto * vdot = ggml_get_type_traits_cpu(funcs_cpu->vec_dot_type);
            vdot->from_float(y1.data(), q8.data(), kVecSize);
            if (useQ4_1) funcs_cpu->vec_dot(kVecSize, &result, 0, q41.data(), 0, q8.data(), 0, 1);
            else funcs_cpu->vec_dot(kVecSize, &result, 0, q40.data(), 0, q8.data(), 0, 1);
        }
        sumq += result;
        t2 = std::chrono::high_resolution_clock::now();
        t = 1e-3*std::chrono::duration_cast<std::chrono::nanoseconds>(t2-t1).count();
        sumqt += t; sumqt2 += t*t; maxqt = std::max(maxqt, t);

    }

    // Report the time (and the average of the dot products so the compiler does not come up with the idea
    // of optimizing away the function calls after figuring that the result is not used).
    sum /= nloop; sumq /= nloop;
    exactSum /= nloop;
    printf("Exact result: <dot> = %g\n",exactSum);
    printf("<dot> = %g, %g\n",sum,sumq);
    sumt /= nloop; sumt2 /= nloop; sumt2 -= sumt*sumt;
    if (sumt2 > 0) sumt2 = sqrt(sumt2);
    printf("time = %g +/- %g us. maxt = %g us\n",sumt,sumt2,maxt);
    sumqt /= nloop; sumqt2 /= nloop; sumqt2 -= sumqt*sumqt;
    if (sumqt2 > 0) sumqt2 = sqrt(sumqt2);
    printf("timeq = %g +/- %g us. maxt = %g us\n",sumqt,sumqt2,maxqt);
    return 0;
}